

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::MergeFrom
          (ImageFeatureType_ImageSizeRange *this,ImageFeatureType_ImageSizeRange *from)

{
  void *pvVar1;
  LogMessage *other;
  SizeRange *pSVar2;
  SizeRange *pSVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/FeatureTypes.pb.cc"
               ,0x602);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pSVar3 = from->widthrange_;
  if (pSVar3 != (SizeRange *)0x0 &&
      from != (ImageFeatureType_ImageSizeRange *)&_ImageFeatureType_ImageSizeRange_default_instance_
     ) {
    pSVar2 = this->widthrange_;
    if (pSVar2 == (SizeRange *)0x0) {
      pSVar2 = (SizeRange *)operator_new(0x28);
      SizeRange::SizeRange(pSVar2);
      this->widthrange_ = pSVar2;
      pSVar3 = from->widthrange_;
    }
    if (pSVar3 == (SizeRange *)0x0) {
      pSVar3 = (SizeRange *)&_SizeRange_default_instance_;
    }
    SizeRange::MergeFrom(pSVar2,pSVar3);
  }
  pSVar3 = from->heightrange_;
  if (pSVar3 != (SizeRange *)0x0 &&
      from != (ImageFeatureType_ImageSizeRange *)&_ImageFeatureType_ImageSizeRange_default_instance_
     ) {
    pSVar2 = this->heightrange_;
    if (pSVar2 == (SizeRange *)0x0) {
      pSVar2 = (SizeRange *)operator_new(0x28);
      SizeRange::SizeRange(pSVar2);
      this->heightrange_ = pSVar2;
      pSVar3 = from->heightrange_;
    }
    if (pSVar3 == (SizeRange *)0x0) {
      pSVar3 = (SizeRange *)&_SizeRange_default_instance_;
    }
    SizeRange::MergeFrom(pSVar2,pSVar3);
  }
  return;
}

Assistant:

void ImageFeatureType_ImageSizeRange::MergeFrom(const ImageFeatureType_ImageSizeRange& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_widthrange()) {
    mutable_widthrange()->::CoreML::Specification::SizeRange::MergeFrom(from.widthrange());
  }
  if (from.has_heightrange()) {
    mutable_heightrange()->::CoreML::Specification::SizeRange::MergeFrom(from.heightrange());
  }
}